

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.h
# Opt level: O3

void __thiscall
mau::LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Set
          (LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_> *this,
          basic_endpoint<asio::ip::udp> *value)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar4 == 0) {
    uVar1 = *(undefined8 *)&(value->impl_).data_;
    uVar2 = *(undefined8 *)((long)&(value->impl_).data_ + 8);
    uVar3 = *(undefined8 *)((long)&(value->impl_).data_ + 0x14);
    *(undefined8 *)((long)&(this->Value).impl_.data_ + 0xc) =
         *(undefined8 *)((long)&(value->impl_).data_ + 0xc);
    *(undefined8 *)((long)&(this->Value).impl_.data_ + 0x14) = uVar3;
    *(undefined8 *)&(this->Value).impl_.data_ = uVar1;
    *(undefined8 *)((long)&(this->Value).impl_.data_ + 8) = uVar2;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void Set(const T& value)
    {
        Locker locker(TheLock);
        Value = value;
    }